

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O3

Object * __thiscall
punky::eval::Evaluator::eval_program
          (Object *__return_storage_ptr__,Evaluator *this,Environment *env)

{
  _Head_base<0UL,_punky::ast::Program_*,_false> _Var1;
  pointer puVar2;
  variant_alternative_t<3UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *__any;
  ObjectType *pOVar3;
  pointer puVar4;
  _Variadic_union<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  *local_98;
  ObjectType local_90;
  _Variadic_union<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  local_88;
  ulong local_68;
  Object local_60;
  
  local_90 = Null;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_68 = 0;
  _Var1._M_head_impl =
       (this->m_program)._M_t.
       super___uniq_ptr_impl<punky::ast::Program,_std::default_delete<punky::ast::Program>_>._M_t.
       super__Tuple_impl<0UL,_punky::ast::Program_*,_std::default_delete<punky::ast::Program>_>.
       super__Head_base<0UL,_punky::ast::Program_*,_false>._M_head_impl;
  puVar4 = *(pointer *)
            &((_Var1._M_head_impl)->m_statements).
             super__Vector_base<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
  ;
  puVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->m_statements + 8);
  if (puVar4 != puVar2) {
    do {
      eval(&local_60,(AstNode *)puVar4->_M_t,env);
      local_90 = local_60.m_type;
      local_98 = &local_88;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>_&>
        ::_S_vtable._M_arr
        [local_60.m_value.
         super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
         .
         super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         ._M_index]._M_data)((anon_class_8_1_8991fb9c *)&local_98,&local_60.m_value);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>_&>
        ::_S_vtable._M_arr
        [local_60.m_value.
         super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
         .
         super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_98,&local_60.m_value);
      if (local_90 == Error) break;
      if (local_90 == Return) {
        __any = std::
                get<3ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                          ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                            *)&local_88);
        pOVar3 = (ObjectType *)std::__any_caster<punky::obj::Object>(__any);
        if (pOVar3 == (ObjectType *)0x0) {
          std::__throw_bad_any_cast();
        }
        __return_storage_ptr__->m_type = *pOVar3;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                           *)&__return_storage_ptr__->m_value,
                          (_Copy_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                           *)(pOVar3 + 2));
        goto LAB_001125b0;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  __return_storage_ptr__->m_type = local_90;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                     *)&__return_storage_ptr__->m_value,
                    (_Move_ctor_base<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                     *)&local_88);
LAB_001125b0:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>_&>
    ::_S_vtable._M_arr[local_68 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_60,
             (variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
              *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_program(env::Environment& env) const
{
    Object result{};
    for (const auto& stmt : m_program->statements())
    {
        result = eval(*stmt, env);

        if (result.m_type == ObjectType::Return)
            return std::any_cast<Object>(std::get<std::any>(result.m_value));

        if (result.m_type == ObjectType::Error)
            return result;
    }
    return result;
}